

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_chatwindow.cpp
# Opt level: O0

void ChatWindow::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QMetaType QVar1;
  QMetaType local_38;
  QMetaType local_30;
  QObject *local_28;
  ChatWindow *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (ChatWindow *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    switch(_id) {
    case 0:
      attemptConnection((ChatWindow *)_o);
      break;
    case 1:
      connectedToServer((ChatWindow *)_o);
      break;
    case 2:
      attemptLogin((ChatWindow *)_o,(QString *)_a[1]);
      break;
    case 3:
      loggedIn((ChatWindow *)_o);
      break;
    case 4:
      loginFailed((ChatWindow *)_o,(QString *)_a[1]);
      break;
    case 5:
      messageReceived((ChatWindow *)_o,(QString *)_a[1],(QString *)_a[2]);
      break;
    case 6:
      sendMessage((ChatWindow *)_o);
      break;
    case 7:
      disconnectedFromServer((ChatWindow *)_o);
      break;
    case 8:
      userJoined((ChatWindow *)_o,(QString *)_a[1]);
      break;
    case 9:
      userLeft((ChatWindow *)_o,(QString *)_a[1]);
      break;
    case 10:
      error((ChatWindow *)_o,*_a[1]);
    }
  }
  else if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 10) {
      if (*_a[1] == 0) {
        QVar1 = QMetaType::fromType<QAbstractSocket::SocketError>();
        **(undefined8 **)_t = QVar1.d_ptr;
      }
      else {
        memset(&local_38,0,8);
        QMetaType::QMetaType(&local_38);
        **(undefined8 **)_t = local_38.d_ptr;
      }
    }
    else {
      memset(&local_30,0,8);
      QMetaType::QMetaType(&local_30);
      **(undefined8 **)_t = local_30.d_ptr;
    }
  }
  return;
}

Assistant:

void ChatWindow::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<ChatWindow *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->attemptConnection(); break;
        case 1: _t->connectedToServer(); break;
        case 2: _t->attemptLogin((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->loggedIn(); break;
        case 4: _t->loginFailed((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->messageReceived((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 6: _t->sendMessage(); break;
        case 7: _t->disconnectedFromServer(); break;
        case 8: _t->userJoined((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 9: _t->userLeft((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 10: _t->error((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 10:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        }
    }
}